

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

int datatypes_match(MOJOSHADER_astDataType *a,MOJOSHADER_astDataType *b)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = 0;
  do {
    if (a == b) goto LAB_0012c09e;
    if (a->type != b->type) {
      return 0;
    }
    switch(a->type) {
    case MOJOSHADER_AST_DATATYPE_STRUCT:
      if ((a->array).elements != (b->array).elements) {
        return 0;
      }
      lVar4 = -1;
      lVar5 = 0;
      while (lVar4 = lVar4 + 1, lVar4 < (a->array).elements) {
        iVar3 = datatypes_match(*(MOJOSHADER_astDataType **)((long)(a->array).base + lVar5),
                                *(MOJOSHADER_astDataType **)((long)(b->array).base + lVar5));
        if (iVar3 == 0) {
          return 0;
        }
        plVar1 = (long *)((long)&((a->structure).members)->identifier + lVar5);
        plVar2 = (long *)((long)&((b->structure).members)->identifier + lVar5);
        lVar5 = lVar5 + 0x10;
        if (*plVar1 != *plVar2) {
          return 0;
        }
      }
      goto LAB_0012c09e;
    case MOJOSHADER_AST_DATATYPE_ARRAY:
    case MOJOSHADER_AST_DATATYPE_VECTOR:
      if ((a->array).elements != (b->array).elements) {
        return 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_MATRIX:
      if ((a->array).elements != (b->array).elements) {
        return 0;
      }
      if ((a->matrix).columns != (b->matrix).columns) {
        return 0;
      }
      break;
    case MOJOSHADER_AST_DATATYPE_BUFFER:
      break;
    case MOJOSHADER_AST_DATATYPE_FUNCTION:
      if ((a->function).num_params != (b->function).num_params) {
        return 0;
      }
      if ((a->function).intrinsic != (b->function).intrinsic) {
        return 0;
      }
      iVar3 = datatypes_match((a->array).base,(b->array).base);
      if (iVar3 == 0) {
        return 0;
      }
      lVar4 = 0;
      while (lVar4 < (a->function).num_params) {
        iVar3 = datatypes_match(*(MOJOSHADER_astDataType **)((a->user).name + lVar4 * 8),
                                *(MOJOSHADER_astDataType **)((b->user).name + lVar4 * 8));
        lVar4 = lVar4 + 1;
        if (iVar3 == 0) {
          return 0;
        }
      }
LAB_0012c09e:
      iVar3 = 1;
switchD_0012bfbf_caseD_16:
      return iVar3;
    case MOJOSHADER_AST_DATATYPE_USER:
      goto switchD_0012bfbf_caseD_16;
    default:
      __assert_fail("0 && \"unexpected case\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x13d,
                    "int datatypes_match(const MOJOSHADER_astDataType *, const MOJOSHADER_astDataType *)"
                   );
    }
    b = (b->array).base;
    a = (a->array).base;
  } while( true );
}

Assistant:

static int datatypes_match(const MOJOSHADER_astDataType *a,
                           const MOJOSHADER_astDataType *b)
{
    int i;

    if (a == b)
        return 1;
    else if (a->type != b->type)
        return 0;

    switch (a->type)
    {
        case MOJOSHADER_AST_DATATYPE_STRUCT:
            if (a->structure.member_count != b->structure.member_count)
                return 0;
            for (i = 0; i < a->structure.member_count; i++)
            {
                if (!datatypes_match(a->structure.members[i].datatype,
                                     b->structure.members[i].datatype))
                    return 0;
                // stringcache'd, pointer compare is safe.
                else if (a->structure.members[i].identifier !=
                         b->structure.members[i].identifier)
                    return 0;
            } // for
            return 1;

        case MOJOSHADER_AST_DATATYPE_ARRAY:
            if (a->array.elements != b->array.elements)
                return 0;
            else if (!datatypes_match(a->array.base, b->array.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_VECTOR:
            if (a->vector.elements != b->vector.elements)
                return 0;
            else if (!datatypes_match(a->vector.base, b->vector.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_MATRIX:
            if (a->matrix.rows != b->matrix.rows)
                return 0;
            else if (a->matrix.columns != b->matrix.columns)
                return 0;
            else if (!datatypes_match(a->matrix.base, b->matrix.base))
                return 0;
            return 1;

        case MOJOSHADER_AST_DATATYPE_BUFFER:
            return datatypes_match(a->buffer.base, b->buffer.base);

        case MOJOSHADER_AST_DATATYPE_FUNCTION:
            if (a->function.num_params != b->function.num_params)
                return 0;
            else if (a->function.intrinsic != b->function.intrinsic)
                return 0;
            else if (!datatypes_match(a->function.retval, b->function.retval))
                return 0;
            for (i = 0; i < a->function.num_params; i++)
            {
                if (!datatypes_match(a->function.params[i], b->function.params[i]))
                    return 0;
            } // for
            return 1;

        case MOJOSHADER_AST_DATATYPE_USER:
            return 0;  // pointers must match, this clearly didn't.

        default:
            assert(0 && "unexpected case");
            return 0;
    } // switch

    return 0;
}